

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O3

ostream * pstack::operator<<(ostream *os,JSON<pstack::Dwarf::CIE,_const_pstack::Dwarf::CFI_*> *dcie)

{
  ostream *poVar1;
  JObject *pJVar2;
  DumpCFAInsns local_58;
  unsigned_long local_40;
  JObject local_38;
  uint local_28;
  uint local_24;
  char local_1f [7];
  
  local_38.sep = "";
  local_38.os = os;
  std::__ostream_insert<char,std::char_traits<char>>(os,"{ ",2);
  local_28 = (uint)dcie->object->version;
  local_1f[0] = '\0';
  pJVar2 = JObject::field<char[8],int,char>
                     (&local_38,(char (*) [8])0x1678eb,(int *)&local_28,local_1f);
  local_1f[1] = 0;
  pJVar2 = JObject::field<char[13],std::__cxx11::string,char>
                     (pJVar2,(char (*) [13])"augmentation",&dcie->object->augmentation,local_1f + 1)
  ;
  local_1f[2] = 0;
  pJVar2 = JObject::field<char[10],unsigned_int,char>
                     (pJVar2,(char (*) [10])"codeAlign",&dcie->object->codeAlign,local_1f + 2);
  local_1f[3] = 0;
  pJVar2 = JObject::field<char[10],int,char>
                     (pJVar2,(char (*) [10])"dataAlign",&dcie->object->dataAlign,local_1f + 3);
  local_1f[4] = 0;
  pJVar2 = JObject::field<char[19],int,char>
                     (pJVar2,(char (*) [19])"return address reg",&dcie->object->rar,local_1f + 4);
  local_40 = dcie->object->end - dcie->object->initial_instructions;
  local_1f[5] = 0;
  pJVar2 = JObject::field<char[19],unsigned_long,char>
                     (pJVar2,(char (*) [19])"instruction length",&local_40,local_1f + 5);
  local_24 = (uint)dcie->object->lsdaEncoding;
  local_1f[6] = 0;
  pJVar2 = JObject::field<char[14],int,char>
                     (pJVar2,(char (*) [14])"LSDA encoding",(int *)&local_24,local_1f + 6);
  local_58.start = dcie->object->initial_instructions;
  local_58.end = dcie->object->end;
  pJVar2 = JObject::field<char[13],pstack::DumpCFAInsns,pstack::Dwarf::CFI_const*>
                     (pJVar2,(char (*) [13])"instructions",&local_58,dcie->context);
  poVar1 = pJVar2->os;
  JObject::~JObject(&local_38);
  return poVar1;
}

Assistant:

std::ostream &
operator <<(std::ostream &os, const JSON<Dwarf::CIE, const Dwarf::CFI *> &dcie)
{
    return JObject(os)
    .field("version", int(dcie.object.version))
    .field("augmentation", dcie.object.augmentation)
    .field("codeAlign", dcie.object.codeAlign)
    .field("dataAlign", dcie.object.dataAlign)
    .field("return address reg", dcie.object.rar)
    .field("instruction length", dcie.object.end - dcie.object.initial_instructions)
    .field("LSDA encoding", int(dcie.object.lsdaEncoding))
    .field("instructions", DumpCFAInsns(dcie.object.initial_instructions, dcie.object.end), dcie.context);
}